

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O1

string * cmSearchPathStripBin(string *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  size_t len;
  
  uVar1 = s->_M_string_length;
  if (uVar1 < 4) {
LAB_0023eac8:
    if (4 < uVar1) {
      iVar3 = strcmp((s->_M_dataplus)._M_p + (uVar1 - 5),"/sbin");
      if (iVar3 == 0) goto LAB_0023eb03;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + uVar1);
  }
  else {
    iVar3 = strcmp((s->_M_dataplus)._M_p + (uVar1 - 4),"/bin");
    if (iVar3 != 0) goto LAB_0023eac8;
LAB_0023eb03:
    cmsys::SystemTools::GetFilenamePath(__return_storage_ptr__,s);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string cmSearchPathStripBin(std::string const& s)
{
  // If the path is a PREFIX/bin case then add its parent instead.
  if ((cmHasLiteralSuffix(s, "/bin")) || (cmHasLiteralSuffix(s, "/sbin"))) {
    return cmSystemTools::GetFilenamePath(s);
  }
  return s;
}